

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hxx
# Opt level: O2

size_t lineage::loadEdges(string *fileName,Problem *problem)

{
  pointer pEVar1;
  istream *piVar2;
  double *pdVar3;
  size_t sVar4;
  Edge e;
  ifstream file;
  
  pEVar1 = (problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar1) {
    (problem->edges).super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
    super__Vector_impl_data._M_finish = pEVar1;
  }
  std::ifstream::ifstream(&file,(string *)fileName,_S_in);
  sVar4 = 0;
  while( true ) {
    piVar2 = (istream *)std::istream::operator>>((istream *)&file,&e.t0);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&e.v0);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&e.t1);
    pdVar3 = (double *)std::istream::operator>>(piVar2,&e.v1);
    piVar2 = std::istream::_M_extract<double>(pdVar3);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::push_back(&problem->edges,&e);
    sVar4 = sVar4 + 1;
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&file);
  return sVar4;
}

Assistant:

inline
size_t loadEdges(const std::string& fileName, Problem& problem)
{
    problem.edges.clear();

    std::ifstream file(fileName);

    Edge e;
    size_t counter = 0;
    while (file >> e.t0 >> e.v0 >> e.t1 >> e.v1 >> e.weight)
    {
        problem.edges.push_back(e);
        ++counter;
    }

    file.close();

    return counter;
}